

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::MirrorMaterial> *material,ssize_t id)

{
  int __oflag;
  XMLWriter *in_RDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  Vec3fa *in_stack_fffffffffffffed0;
  allocator *paVar1;
  char *in_stack_fffffffffffffed8;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  XMLWriter *local_28;
  
  local_28 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"material",&local_49);
  std::__cxx11::string::string(local_80,(string *)(*in_RSI + 0x30));
  open(in_RDI,(char *)local_48,(int)local_28,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  store(local_28,in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  paVar1 = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"parameters",paVar1);
  open(in_RDI,(char *)local_a0,__oflag);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  store_parm(local_28,(char *)paVar1,in_stack_fffffffffffffed0);
  paVar1 = &local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"parameters",paVar1);
  close(in_RDI,(int)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"material",&local_f1);
  close(in_RDI,(int)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

void XMLWriter::store(Ref<MirrorMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","Mirror");
    open("parameters");
    store_parm("reflectance",material->reflectance);
    close("parameters");
    close("material");
  }